

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPICodemodel.cxx
# Opt level: O0

Value * __thiscall
anon_unknown.dwarf_d185f6::Target::DumpDependency
          (Value *__return_storage_ptr__,Target *this,cmTargetDepend *td)

{
  cmGeneratorTarget *gt;
  Value *this_00;
  cmListFileBacktrace *bt;
  string local_70;
  Value local_50;
  undefined1 local_21;
  cmTargetDepend *local_20;
  cmTargetDepend *td_local;
  Target *this_local;
  Value *dependency;
  
  local_21 = 0;
  local_20 = td;
  td_local = (cmTargetDepend *)this;
  this_local = (Target *)__return_storage_ptr__;
  Json::Value::Value(__return_storage_ptr__,objectValue);
  gt = cmTargetDepend::operator_cast_to_cmGeneratorTarget_(local_20);
  TargetId(&local_70,gt,&this->TopBuild);
  Json::Value::Value(&local_50,&local_70);
  this_00 = Json::Value::operator[](__return_storage_ptr__,"id");
  Json::Value::operator=(this_00,&local_50);
  Json::Value::~Value(&local_50);
  std::__cxx11::string::~string((string *)&local_70);
  bt = cmTargetDepend::GetBacktrace(local_20);
  AddBacktrace(this,__return_storage_ptr__,bt);
  return __return_storage_ptr__;
}

Assistant:

Json::Value Target::DumpDependency(cmTargetDepend const& td)
{
  Json::Value dependency = Json::objectValue;
  dependency["id"] = TargetId(td, this->TopBuild);
  this->AddBacktrace(dependency, td.GetBacktrace());
  return dependency;
}